

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue_to_string.c
# Opt level: O2

int string_concat(char **string,char *to_concat)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  LOGGER_LOG p_Var4;
  size_t __size;
  
  sVar1 = strlen(to_concat);
  pcVar3 = *string;
  if (pcVar3 == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(pcVar3);
  }
  __size = 0xffffffffffffffff;
  if (sVar2 < -sVar1 - 2) {
    __size = sVar2 + sVar1 + 1;
  }
  if ((__size != 0xffffffffffffffff) &&
     (pcVar3 = (char *)realloc(pcVar3,__size), pcVar3 != (char *)0x0)) {
    *string = pcVar3;
    memcpy(pcVar3 + sVar2,to_concat,sVar1 + 1);
    return 0;
  }
  p_Var4 = xlogging_get_log_function();
  if (p_Var4 != (LOGGER_LOG)0x0) {
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue_to_string.c"
              ,"string_concat",0x2b,1,"Cannot allocate memory for the new string, size:%zu",__size);
  }
  return 0x2c;
}

Assistant:

static int string_concat(char** string, const char* to_concat)
{
    int result;
    char* new_string;
    size_t length = strlen(to_concat) + 1;
    size_t src_length;

    if (*string != NULL)
    {
        src_length = strlen(*string);
    }
    else
    {
        src_length = 0;
    }

    size_t realloc_size = safe_add_size_t(src_length, length);
    if (realloc_size == SIZE_MAX ||
        (new_string = (char*)realloc(*string, realloc_size)) == NULL)
    {
        LogError("Cannot allocate memory for the new string, size:%zu", realloc_size);
        result = MU_FAILURE;
    }
    else
    {
        *string = new_string;
        (void)memcpy(*string + src_length, to_concat, length);
        result = 0;
    }

    return result;
}